

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall crnlib::mipmapped_texture::assign(mipmapped_texture *this,face_vec *faces)

{
  mip_level *pmVar1;
  uint uVar2;
  component_flags cVar3;
  pixel_format pVar4;
  
  if (faces->m_size != 0) {
    free_all_mips(this);
    pmVar1 = *faces->m_p->m_p;
    uVar2 = pmVar1->m_height;
    cVar3 = pmVar1->m_comp_flags;
    pVar4 = pmVar1->m_format;
    this->m_width = pmVar1->m_width;
    this->m_height = uVar2;
    this->m_comp_flags = cVar3;
    this->m_format = pVar4;
    vector<crnlib::vector<crnlib::mip_level_*>_>::swap(&this->m_faces,faces);
    return;
  }
  return;
}

Assistant:

inline bool empty() const
        {
            return !m_size;
        }